

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O3

ON_BoundingBox * __thiscall
ON_OutlineFigure::BoundingBox(ON_BoundingBox *__return_storage_ptr__,ON_OutlineFigure *this)

{
  ON_OutlineFigurePoint *pOVar1;
  undefined8 uVar2;
  ON_2fPoint OVar3;
  ON_2fPoint *pOVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  bool bVar10;
  ON__UINT8 OVar11;
  ON__UINT32 OVar12;
  uint uVar13;
  uint uVar14;
  float *pfVar15;
  long lVar16;
  ON__UINT32 j;
  ulong uVar17;
  uint uVar18;
  ON__UINT32 OVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  ON_2fPoint bbox_cv_max;
  ON_2fPoint bbox_cv_min;
  ON_OutlineFigurePoint cv [4];
  ON_BoundingBox bez_bbox;
  ON_BezierCurve bez;
  float local_104;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  float local_e8;
  ON_2fPoint local_e0;
  float local_d4;
  float local_d0;
  ON__UINT32 local_cc;
  ON_OutlineFigurePoint *local_c8;
  ON_2fPoint local_c0;
  undefined1 local_b8 [8];
  float local_b0;
  undefined4 local_ac;
  float fStack_a8;
  float local_a4;
  undefined8 local_a0;
  float local_98;
  undefined8 local_94;
  float local_8c;
  ON_OutlineFigure *local_88;
  ON_BoundingBox local_80;
  ON_BezierCurve local_50;
  
  OVar11 = this->m_bbox_status;
  if (OVar11 == '\0') {
    this->m_bbox_status = '\a';
    OVar19 = 0;
    OVar12 = Internal_FigureEndDex(this,false);
    if (OVar12 != 0) {
      pOVar1 = (this->m_points).m_a;
      local_100 = (pOVar1->m_point).x;
      local_104 = (pOVar1->m_point).y;
      local_e0 = pOVar1->m_point;
      local_f4 = local_e0.x;
      local_f0 = local_e0.y;
      local_fc = local_104;
      local_f8 = local_100;
      local_ec = local_f0;
      local_d4 = local_f0;
      local_d0 = local_f4;
      local_c0 = local_e0;
      fVar23 = local_f4;
      local_e8 = local_f0;
      do {
        local_c8 = (ON_OutlineFigurePoint *)CONCAT44(local_c8._4_4_,fVar23);
        uVar13 = Internal_SegmentDegree(this,OVar19);
        uVar14 = OVar19;
        fVar23 = local_c8._0_4_;
        if (0xfffffffc < uVar13 - 4) {
          uVar2._4_4_ = pOVar1[uVar13 + OVar19].m_point.x;
          fVar20 = uVar2._4_4_;
          if ((local_f8 <= uVar2._4_4_) && (fVar20 = local_f8, local_100 < uVar2._4_4_)) {
            local_100 = uVar2._4_4_;
          }
          local_f8 = fVar20;
          uVar2._4_4_ = pOVar1[uVar13 + OVar19].m_point.y;
          fVar20 = uVar2._4_4_;
          if ((local_fc <= uVar2._4_4_) && (fVar20 = local_fc, local_104 < uVar2._4_4_)) {
            local_104 = uVar2._4_4_;
          }
          local_fc = fVar20;
          if (1 < uVar13) {
            uVar14 = OVar19 + 1;
            uVar2._4_4_ = pOVar1[uVar14].m_point.x;
            fVar20 = pOVar1[uVar14].m_point.y;
            if (local_c8._0_4_ <= uVar2._4_4_) {
              if (local_f4 < uVar2._4_4_) {
                local_e0.x = uVar2._4_4_;
                local_f4 = uVar2._4_4_;
              }
            }
            else {
              local_c0.x = uVar2._4_4_;
              local_d0 = uVar2._4_4_;
              fVar23 = uVar2._4_4_;
            }
            pfVar15 = &local_c0.y;
            uVar2._4_4_ = local_e8;
            fVar22 = fVar20;
            fVar24 = fVar20;
            fVar21 = local_f0;
            if ((fVar20 < local_ec) ||
               (pfVar15 = &local_e0.y, uVar2._4_4_ = fVar20, fVar22 = local_ec, fVar24 = local_d4,
               fVar21 = fVar20, local_e8 < fVar20)) {
              local_f0 = fVar21;
              local_d4 = fVar24;
              local_ec = fVar22;
              *pfVar15 = fVar20;
              local_e8 = uVar2._4_4_;
            }
            if (uVar13 == 3) {
              uVar14 = OVar19 + 2;
              uVar2._4_4_ = pOVar1[uVar14].m_point.x;
              fVar20 = pOVar1[uVar14].m_point.y;
              if (fVar23 <= uVar2._4_4_) {
                if (local_f4 < uVar2._4_4_) {
                  local_e0.x = uVar2._4_4_;
                  local_f4 = uVar2._4_4_;
                }
              }
              else {
                local_c0.x = uVar2._4_4_;
                local_d0 = uVar2._4_4_;
                fVar23 = uVar2._4_4_;
              }
              pfVar15 = &local_c0.y;
              uVar2._4_4_ = local_f0;
              fVar22 = fVar20;
              fVar24 = fVar20;
              fVar21 = local_e8;
              if ((fVar20 < local_ec) ||
                 (pfVar15 = &local_e0.y, uVar2._4_4_ = fVar20, fVar22 = local_ec, fVar24 = local_d4,
                 fVar21 = fVar20, local_e8 < fVar20)) {
                local_d4 = fVar24;
                local_ec = fVar22;
                *pfVar15 = fVar20;
                local_f0 = uVar2._4_4_;
                local_e8 = fVar21;
              }
            }
          }
        }
        OVar19 = uVar14 + 1;
      } while (OVar19 < OVar12);
      if ((((local_d0 < local_f8) || (local_100 < local_f4)) || (local_d4 < local_fc)) ||
         (local_104 < local_f0)) {
        lVar16 = 4;
        do {
          *(undefined4 *)((long)&local_c0.y + lVar16) = 0;
          *(ON_2fPoint *)(local_b8 + lVar16) = ON_2fPoint::NanPoint;
          lVar16 = lVar16 + 0xc;
        } while (lVar16 != 0x34);
        local_8c = (pOVar1->m_point).y;
        local_94._0_1_ = pOVar1->m_point_type;
        local_94._1_1_ = pOVar1->m_point_proximity;
        local_94._2_2_ = pOVar1->m_figure_index;
        local_94._4_4_ = (pOVar1->m_point).x;
        uVar17 = 0;
        local_cc = OVar12;
        local_c8 = pOVar1;
        local_88 = this;
        do {
          OVar19 = (ON__UINT32)uVar17;
          uVar14 = Internal_SegmentDegree(this,OVar19);
          OVar12 = local_cc;
          if ((uVar14 & 0xfffffffe) == 2) {
            local_b0 = local_c8[uVar17].m_point.y;
            local_b8 = local_c8[uVar17].m_point_type;
            uVar13 = OVar19 + 1;
            fVar23 = local_c8[uVar13].m_point.y;
            pOVar1 = local_c8 + uVar13;
            uVar2._0_1_ = pOVar1->m_point_type;
            uVar2._1_1_ = pOVar1->m_point_proximity;
            uVar2._2_2_ = pOVar1->m_figure_index;
            uVar2._4_4_ = (pOVar1->m_point).x;
            local_ac = (undefined4)uVar2;
            OVar3.y = fVar23;
            OVar3.x = uVar2._4_4_;
            uVar18 = OVar19 + 2;
            local_98 = local_c8[uVar18].m_point.y;
            pOVar1 = local_c8 + uVar18;
            local_a0._0_1_ = pOVar1->m_point_type;
            local_a0._1_1_ = pOVar1->m_point_proximity;
            local_a0._2_2_ = pOVar1->m_figure_index;
            local_a0._4_4_ = (pOVar1->m_point).x;
            fVar20 = fVar23;
            local_e0 = OVar3;
            local_c0 = OVar3;
            fStack_a8 = uVar2._4_4_;
            local_a4 = fVar23;
            fVar22 = uVar2._4_4_;
            if (uVar14 == 3) {
              if (uVar2._4_4_ <= (float)local_a0._4_4_) {
                if (uVar2._4_4_ < (float)local_a0._4_4_) {
                  local_e0.y = fVar23;
                  local_e0.x = (float)local_a0._4_4_;
                  fVar22 = (float)local_a0._4_4_;
                }
              }
              else {
                local_c0.y = fVar23;
                local_c0.x = (float)local_a0._4_4_;
                uVar2._4_4_ = (float)local_a0._4_4_;
              }
              if (fVar23 <= local_98) {
                pOVar4 = &local_e0;
                fVar24 = local_98;
                if (fVar23 < local_98) goto LAB_0048d792;
              }
              else {
                pOVar4 = &local_c0;
                fVar24 = fVar23;
                fVar23 = local_98;
LAB_0048d792:
                pOVar4->y = local_98;
                fVar20 = fVar24;
              }
              local_8c = local_c8[OVar19 + 3].m_point.y;
              pOVar1 = local_c8 + (OVar19 + 3);
              local_94._0_1_ = pOVar1->m_point_type;
              local_94._1_1_ = pOVar1->m_point_proximity;
              local_94._2_2_ = pOVar1->m_figure_index;
              local_94._4_4_ = (pOVar1->m_point).x;
              uVar13 = uVar18;
            }
            OVar19 = uVar13;
            if (((uVar2._4_4_ < local_f8) || (local_100 < fVar22)) ||
               ((fVar23 < local_fc || (OVar12 = local_cc, local_104 < fVar20)))) {
              ON_BezierCurve::ON_BezierCurve(&local_50,3,false,uVar14 + 1);
              pfVar15 = &local_b0;
              uVar17 = 0;
              do {
                ON_3dPoint::ON_3dPoint(&local_80.m_min,(double)pfVar15[-1],(double)*pfVar15,0.0);
                ON_BezierCurve::SetCV(&local_50,(int)uVar17,&local_80.m_min);
                uVar17 = uVar17 + 1;
                pfVar15 = pfVar15 + 3;
              } while (uVar14 + 1 != uVar17);
              ON_BezierCurve::BoundingBox(&local_80,&local_50);
              bVar10 = ON_BoundingBox::IsNotEmpty(&local_80);
              this = local_88;
              OVar12 = local_cc;
              if (((bVar10) && (-1.2343210235867887e+38 < local_80.m_min.x)) &&
                 ((local_80.m_max.x < 1.2343210235867887e+38 &&
                  ((-1.2343210235867887e+38 < local_80.m_min.y &&
                   (local_80.m_max.y < 1.2343210235867887e+38)))))) {
                ON_2fPoint::Set(&local_c0,(float)local_80.m_min.x,(float)local_80.m_min.y);
                ON_2fPoint::Set(&local_e0,(float)local_80.m_max.x,(float)local_80.m_max.y);
              }
              ON_BezierCurve::~ON_BezierCurve(&local_50);
            }
          }
          uVar17 = (ulong)(OVar19 + 1);
        } while (OVar19 + 1 < OVar12);
        (this->m_bbox_min).x = local_f8;
        (this->m_bbox_min).y = local_fc;
        (this->m_bbox_max).x = local_100;
        (this->m_bbox_max).y = local_104;
        this->m_bbox_status = '\x01';
        bVar10 = ON_2fPoint::operator==(&this->m_bbox_min,&this->m_bbox_max);
        if (((bVar10) && (this->m_figure_type < 5)) &&
           ((0x13U >> (this->m_figure_type & 0x1f) & 1) != 0)) {
          this->m_figure_type = NotPerimeter;
        }
      }
      else {
        (this->m_bbox_min).x = local_f8;
        (this->m_bbox_min).y = local_fc;
        (this->m_bbox_max).x = local_100;
        (this->m_bbox_max).y = local_104;
        this->m_bbox_status = '\x01';
      }
    }
    OVar11 = this->m_bbox_status;
  }
  dVar9 = ON_BoundingBox::NanBoundingBox.m_max.z;
  dVar8 = ON_BoundingBox::NanBoundingBox.m_max.x;
  dVar7 = ON_BoundingBox::NanBoundingBox.m_min.z;
  dVar6 = ON_BoundingBox::NanBoundingBox.m_min.y;
  dVar5 = ON_BoundingBox::NanBoundingBox.m_min.x;
  if (OVar11 == '\x01') {
    ON_3dPoint::ON_3dPoint((ON_3dPoint *)local_b8,&this->m_bbox_min);
    ON_3dPoint::ON_3dPoint(&local_80.m_min,&this->m_bbox_max);
    ON_BoundingBox::ON_BoundingBox(__return_storage_ptr__,(ON_3dPoint *)local_b8,&local_80.m_min);
  }
  else {
    (__return_storage_ptr__->m_max).y = ON_BoundingBox::NanBoundingBox.m_max.y;
    (__return_storage_ptr__->m_max).z = dVar9;
    (__return_storage_ptr__->m_min).z = dVar7;
    (__return_storage_ptr__->m_max).x = dVar8;
    (__return_storage_ptr__->m_min).x = dVar5;
    (__return_storage_ptr__->m_min).y = dVar6;
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_BoundingBox ON_OutlineFigure::BoundingBox() const
{
  while (0 == m_bbox_status)
  {
    m_bbox_status = 7;

    const ON__UINT32 figure_end_dex = Internal_FigureEndDex(false);
    if (0 == figure_end_dex)
      break;

    const ON_OutlineFigurePoint* a = m_points.Array();
    ON_2fPoint bbox_min = a[0].m_point;
    ON_2fPoint bbox_max = bbox_min;
    ON_2fPoint bbox_cv_min = bbox_min;
    ON_2fPoint bbox_cv_max = bbox_max;
    
    for (ON__UINT32 i = 0U; i < figure_end_dex; ++i)
    {
      const ON__UINT32 degree = ON_OutlineFigure::Internal_SegmentDegree(i);
      if (degree < 1U || degree > 3U)
        continue;
      // a[i] = start of bezier (line,quadratic,or cubic)
      ON_OutlineFigurePoint p = a[i+degree]; // p = a[i+degree] = end of bezier (line,quadratic,or cubic)
      Internal_GrowBBox(p.m_point, p.m_point, bbox_min, bbox_max);
      if (degree >= 2U)
      {
        p = a[++i]; // p = 1st interior cv of a quadratic or cubic bezier
        Internal_GrowBBox(p.m_point, p.m_point, bbox_cv_min, bbox_cv_max);
        if (3U == degree)
        {
          p = a[++i]; // p = 2nd interior cv of a cubic bezier
          Internal_GrowBBox(p.m_point, p.m_point, bbox_cv_min, bbox_cv_max);
        }
      }
    }

    if (
      bbox_cv_min.x >= bbox_min.x 
      && bbox_cv_max.x <= bbox_max.x
      && bbox_cv_min.y >= bbox_min.y 
      && bbox_cv_max.y <= bbox_max.y
      )
    {
      // If there were any bezier segments, their control points were inside the bounding box of the segment end points.
      m_bbox_min = bbox_min;
      m_bbox_max = bbox_max;
      m_bbox_status = 1;
      break;
    }

    // get bezeir bounding boxes as needed
    ON_OutlineFigurePoint cv[4];
    cv[3] = a[0]; // to suppress potintial uninitialized memory warning

    for (ON__UINT32 i = 0U; i < figure_end_dex; ++i)
    {
      const ON__UINT32 degree = ON_OutlineFigure::Internal_SegmentDegree(i);
      if (degree < 2U || degree > 3U)
        continue; // correct to continue when degree = 1
      cv[0] = a[i]; // [a[i] = start of quadratic or cubic bezier
      cv[1] = a[++i]; // 1st interior cv of a  quadratic or cubic bezer
      bbox_cv_min = cv[1].m_point;
      bbox_cv_max = bbox_cv_min;
      cv[2] = a[i + 1]; // end of quadratic bezier or penultimate cv of a cubic bezier
      if (3U == degree)
      {
        Internal_GrowBBox(cv[2].m_point, cv[2].m_point, bbox_cv_min, bbox_cv_max);
        ++i;
        cv[3] = a[i + 1]; // end of a cubic bezier
      }

      if (
        bbox_cv_min.x >= bbox_min.x 
        && bbox_cv_max.x <= bbox_max.x
        && bbox_cv_min.y >= bbox_min.y 
        && bbox_cv_max.y <= bbox_max.y
        )
      {
        // the control points of this bezier are inside the current bounding box.
        continue;
      }

      // get tight bounding box of this bezier
      ON_BezierCurve bez(3, false, degree + 1);
      for (ON__UINT32 j = 0; j <= degree; j++)
        bez.SetCV(j, ON_3dPoint(cv[j].m_point.x, cv[j].m_point.y, 0.0));

      const ON_BoundingBox bez_bbox = bez.BoundingBox();
      if (bez_bbox.IsNotEmpty())
      {
        const double minf = ON_UNSET_FLOAT;
        const double maxf = ON_UNSET_POSITIVE_FLOAT;
        if (
          minf < bez_bbox.m_min.x 
          && bez_bbox.m_max.x < maxf
          && minf < bez_bbox.m_min.y 
          && bez_bbox.m_max.y < maxf
          )
        {
          bbox_cv_min.Set((float)bez_bbox.m_min.x, (float)bez_bbox.m_min.y);
          bbox_cv_max.Set((float)bez_bbox.m_max.x, (float)bez_bbox.m_max.y);
        }
      }

      Internal_GrowBBox(bbox_cv_min, bbox_cv_max, bbox_cv_min, bbox_cv_max);
    }

    m_bbox_min = bbox_min;
    m_bbox_max = bbox_max;
    m_bbox_status = 1;
    if (m_bbox_min == m_bbox_max)
    {
      if (
        ON_OutlineFigure::Type::Perimeter == m_figure_type
        || ON_OutlineFigure::Type::Unset == m_figure_type
        || ON_OutlineFigure::Type::Unknown == m_figure_type
        )
      {
        m_figure_type = ON_OutlineFigure::Type::NotPerimeter;
      }
    }
    break;
  }

  if (1 == m_bbox_status)
    return ON_BoundingBox(ON_3dPoint(m_bbox_min), ON_3dPoint(m_bbox_max));

  return ON_BoundingBox::NanBoundingBox;
}